

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

void __thiscall ON_wString::CopyToArray(ON_wString *this,int size,char *s)

{
  int iVar1;
  wchar_t *pwVar2;
  ON_wStringHeader *pOVar3;
  bool bVar4;
  char *s_local;
  int size_local;
  ON_wString *this_local;
  
  bVar4 = false;
  if ((0 < size) && (bVar4 = false, s != (char *)0x0)) {
    bVar4 = *s != '\0';
  }
  if ((bVar4) && (pwVar2 = ReserveArray(this,(long)size), pwVar2 != (wchar_t *)0x0)) {
    pOVar3 = Header(this);
    iVar1 = c2w(size,s,pOVar3->string_capacity,this->m_s);
    pOVar3 = Header(this);
    pOVar3->string_length = iVar1;
    pwVar2 = this->m_s;
    pOVar3 = Header(this);
    pwVar2[pOVar3->string_length] = L'\0';
  }
  else {
    Destroy(this);
    Create(this);
  }
  return;
}

Assistant:

void ON_wString::CopyToArray( int size, const char* s )
{
  while (size > 0 && s && s[0])
  {
    if (nullptr == ReserveArray(size))
      break;
    // s = UTF-8 string.
    // m_s = UTF-8, UTF-16, or UTF-32 encoded string.
    // Even with errors, the number of wchar_t elements <= UTF-8 length
    Header()->string_length = c2w(size, s, Header()->string_capacity, m_s);
    m_s[Header()->string_length] = 0;
    return;
  }

  Destroy();
  Create();
}